

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

CService * ResolveService(string *ip,uint16_t port)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  ushort in_DX;
  unsigned_short *in_RSI;
  CService *in_RDI;
  long in_FS_OFFSET;
  optional<CService> serv;
  CService *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  CService *in_stack_fffffffffffffe98;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffffea0;
  optional<CService> *this;
  undefined4 in_stack_fffffffffffffec0;
  unit_test_log_t *this_00;
  DNSLookupFn *in_stack_fffffffffffffed8;
  unsigned_short *puVar4;
  CService *name;
  const_string local_110;
  lazy_ostream local_100 [2];
  assertion_result local_e0 [2];
  unit_test_log_t local_a8 [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)in_DX;
  this_00 = local_a8;
  puVar4 = in_RSI;
  name = in_RDI;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)in_RDI,in_stack_fffffffffffffea0);
  Lookup((string *)name,(uint16_t)((ulong)puVar4 >> 0x30),SUB81((ulong)puVar4 >> 0x28,0),
         in_stack_fffffffffffffed8);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)in_stack_fffffffffffffe88);
  do {
    this = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (unsigned_long)in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)CONCAT44(uVar3,in_stack_fffffffffffffec0),(size_t)in_RSI,
               (const_string *)in_RDI);
    std::optional<CService>::has_value((optional<CService> *)in_stack_fffffffffffffe88);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffe98,(bool)in_stack_fffffffffffffe97);
    in_stack_fffffffffffffe98 = (CService *)boost::unit_test::lazy_ostream::instance();
    tinyformat::format<std::__cxx11::string,unsigned_short>
              ((char *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar3,in_stack_fffffffffffffec0),in_RSI);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (unsigned_long)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe88 = (CService *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_e0,local_100,&local_110,0x2d,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CService::CService(in_stack_fffffffffffffe88);
  std::optional<CService>::value_or<CService>(this,in_stack_fffffffffffffe98);
  CService::~CService(in_stack_fffffffffffffe88);
  std::optional<CService>::~optional((optional<CService> *)in_stack_fffffffffffffe88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static CService ResolveService(const std::string& ip, uint16_t port = 0)
{
    const std::optional<CService> serv{Lookup(ip, port, false)};
    BOOST_CHECK_MESSAGE(serv.has_value(), strprintf("failed to resolve: %s:%i", ip, port));
    return serv.value_or(CService{});
}